

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void assert_throws_macro_passes_basic_type(void)

{
  code *pcVar1;
  long lVar2;
  undefined8 uVar3;
  string *ex;
  string *ex_1;
  
  throwing_function();
  lVar2 = get_test_reporter();
  pcVar1 = *(code **)(lVar2 + 0x38);
  uVar3 = get_test_reporter();
  (*pcVar1)(uVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
            ,0xb6,0,"Expected [throwing_function()] to throw [std::string]");
  return;
}

Assistant:

Ensure(assert_throws_macro_passes_basic_type) {
    assert_throws(std::string, throwing_function());
}